

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O3

void __thiscall xray_re::se_level_changer::state_write(se_level_changer *this,xr_packet *packet)

{
  cse_alife_level_changer::state_write(&this->super_cse_alife_level_changer,packet);
  if (0x7a < (this->super_cse_alife_level_changer).super_cse_alife_space_restrictor.
             super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version) {
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"se_level_changer");
    (*packet->_vptr_xr_packet[0xc])
              (packet,(ulong)(byte)(this->super_cse_alife_level_changer).field_0x199);
    (*packet->_vptr_xr_packet[4])(packet,&this->m_hint);
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,true,"se_level_changer");
    return;
  }
  return;
}

Assistant:

void se_level_changer::state_write(xr_packet& packet)
{
	cse_alife_level_changer::state_write(packet);
	if (m_version >= CSE_VERSION_0x7c_HACK) {
		set_save_marker(packet, SM_SAVE, false, "se_level_changer");
		packet.w_bool(m_enabled);
		packet.w_sz(m_hint);
		set_save_marker(packet, SM_SAVE, true, "se_level_changer");
	}
}